

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

wchar_t ui_entry_search(char *name,int *ind)

{
  bool bVar1;
  ui_entry **ppuVar2;
  int iVar3;
  wchar_t unaff_EBP;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  ppuVar2 = entries;
  wVar5 = L'\0';
  wVar6 = n_entry;
  do {
    if (wVar5 == wVar6) {
      *ind = wVar5;
      unaff_EBP = L'\0';
LAB_001e231e:
      bVar1 = false;
    }
    else {
      wVar4 = (wVar6 + wVar5) / 2;
      iVar3 = strcmp(ppuVar2[wVar4]->name,name);
      if (iVar3 == 0) {
        *ind = wVar4;
        unaff_EBP = L'\x01';
        goto LAB_001e231e;
      }
      if (iVar3 < 0) {
        wVar5 = wVar4 + L'\x01';
        wVar4 = wVar6;
      }
      bVar1 = true;
      wVar6 = wVar4;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

static int ui_entry_search(const char *name, int *ind)
{
	/* They're sorted by name so use a binary search. */
	int ilow = 0, ihigh = n_entry;

	while (1) {
		int imid, cmp;

		if (ilow == ihigh) {
			*ind = ilow;
			return 0;
		}
		imid = (ilow + ihigh) / 2;
		cmp = strcmp(entries[imid]->name, name);
		if (cmp == 0) {
			*ind = imid;
			return 1;
		}
		if (cmp < 0) {
			ilow = imid + 1;
		} else {
			ihigh = imid;
		}
	}
}